

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O3

char * ht_search(ht_hash_table *ht,char *key)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ht_item *phVar4;
  int iVar5;
  
  iVar5 = ht->size;
  iVar1 = ht_hash(key,10,iVar5);
  ht_hash(key,0xb,iVar5);
  phVar4 = ht->items[iVar1 % iVar5];
  if (phVar4 != (ht_item *)0x0) {
    iVar5 = 1;
    do {
      if ((phVar4 != &HT_DELETED_ITEM) && (iVar1 = strcmp(phVar4->key,key), iVar1 == 0)) {
        return phVar4->value;
      }
      iVar1 = ht->size;
      iVar2 = ht_hash(key,10,iVar1);
      iVar3 = ht_hash(key,0xb,iVar1);
      iVar3 = (iVar3 + 1) * iVar5;
      iVar5 = iVar5 + 1;
      phVar4 = ht->items[(iVar3 + iVar2) % iVar1];
    } while (phVar4 != (ht_item *)0x0);
  }
  return (char *)0x0;
}

Assistant:

char* ht_search(ht_hash_table* ht, const char* key) {
    int index = ht_get_hash(key, ht->size, 0);
    ht_item* item = ht->items[index];
    int i = 1;
    while (item != nullptr) {
        if (item != &HT_DELETED_ITEM) {
            if (strcmp(item->key, key) == 0) {
                return item->value;
            }
        }
        index = ht_get_hash(key, ht->size, i);
        item = ht->items[index];
        i++;
    }
    return nullptr;
}